

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O1

DdNode * Cudd_addMinimum(DdManager *dd,DdNode **f,DdNode **g)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  
  pDVar1 = *f;
  pDVar3 = *g;
  pDVar2 = pDVar3;
  if ((pDVar1 == dd->plusinfinity) ||
     (pDVar2 = pDVar1, pDVar1 == pDVar3 || pDVar3 == dd->plusinfinity)) {
    return pDVar2;
  }
  if ((pDVar1->index == 0x7fffffff) && (pDVar3->index == 0x7fffffff)) {
    if ((pDVar1->type).value <= (pDVar3->type).value) {
      pDVar3 = pDVar1;
    }
    return pDVar3;
  }
  if (pDVar3 < pDVar1) {
    *f = pDVar3;
    *g = pDVar1;
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addMinimum(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *F, *G;

    F = *f; G = *g;
    if (F == DD_PLUS_INFINITY(dd)) return(G);
    if (G == DD_PLUS_INFINITY(dd)) return(F);
    if (F == G) return(F);
#if 0
    /* These special cases probably do not pay off. */
    if (F == DD_MINUS_INFINITY(dd)) return(F);
    if (G == DD_MINUS_INFINITY(dd)) return(G);
#endif
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        if (cuddV(F) <= cuddV(G)) {
            return(F);
        } else {
            return(G);
        }
    }
    if (F > G) { /* swap f and g */
        *f = G;
        *g = F;
    }
    return(NULL);

}